

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_BinaryLogicalExpr_Test::TestBody(ExprTest_BinaryLogicalExpr_Test *this)

{
  LogicalExpr lhs_00;
  LogicalExpr lhs_01;
  LogicalExpr lhs_02;
  LogicalExpr lhs_03;
  bool bVar1;
  AssertHelper *this_00;
  AssertionFailure *e_3;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_5;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_4;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  LogicalConstant rhs;
  LogicalConstant lhs;
  AssertionResult gtest_ar_;
  BinaryLogicalExpr e;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  AssertionResult *in_stack_fffffffffffffb70;
  Kind kind;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffb78;
  ExprBase in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  char *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  Type in_stack_fffffffffffffb9c;
  AssertionResult *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  char *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe0;
  AssertionResult *in_stack_fffffffffffffbe8;
  AssertHelper *in_stack_fffffffffffffbf0;
  allocator<char> local_291;
  string local_290 [32];
  AssertionResult local_270 [3];
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_240;
  Impl *local_238;
  byte local_21a;
  allocator<char> local_219;
  string local_218 [32];
  AssertionResult local_1f8 [3];
  int local_1c4;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_1c0;
  Impl *local_1b8;
  Impl *local_1a8;
  byte local_192;
  allocator<char> local_191;
  string local_190 [32];
  AssertionResult local_170 [2];
  ExprBase local_150;
  AssertionResult local_148 [2];
  ExprBase local_128;
  AssertionResult local_120 [2];
  Kind local_100;
  undefined4 local_fc;
  AssertionResult local_f8;
  string local_e8 [48];
  AssertionResult local_b8;
  ExprBase local_a8;
  ExprBase local_98;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_88;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_80;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_78;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  mp::
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  ::BasicBinaryExpr((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
                     *)0x127fa4);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffb70,(bool)in_stack_fffffffffffffb6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x1280c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128140);
  local_70 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffb80.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  local_78.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                 (in_stack_fffffffffffffb78,SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
  local_80.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                 (in_stack_fffffffffffffb78,SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
  local_98.impl_ = (Impl *)local_78.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
             (LogicalConstant)in_stack_fffffffffffffb80.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  local_a8.impl_ = (Impl *)local_80.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
             (LogicalConstant)in_stack_fffffffffffffb80.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
  lhs_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb8c;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb88;
  local_88.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 (in_stack_fffffffffffffb78,(Kind)((ulong)in_stack_fffffffffffffb70 >> 0x20),lhs_00,
                  (LogicalExpr)in_stack_fffffffffffffb80.impl_);
  local_10[0].impl_ = (Impl *)local_88.super_ExprBase.impl_;
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffb70,(bool)in_stack_fffffffffffffb6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
               (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    std::__cxx11::string::~string(local_e8);
    testing::Message::~Message((Message *)0x128369);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1283e4);
  local_fc = 0x33;
  local_100 = mp::internal::ExprBase::kind((ExprBase *)0x1283fc);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (char *)in_stack_fffffffffffffb80.impl_,(Kind *)in_stack_fffffffffffffb78,
             (Kind *)in_stack_fffffffffffffb70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1284a5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x128508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12855d);
  local_128.impl_ =
       (Impl *)mp::
               BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
               ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
                      *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  testing::internal::EqHelper<false>::
  Compare<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (char *)in_stack_fffffffffffffb80.impl_,(LogicalConstant *)in_stack_fffffffffffffb78,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x128614);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x128677);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1286cc);
  local_150.impl_ =
       (Impl *)mp::
               BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
               ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
                      *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  testing::internal::EqHelper<false>::
  Compare<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (char *)in_stack_fffffffffffffb80.impl_,(LogicalConstant *)in_stack_fffffffffffffb78,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x128783);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x1287e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12883e);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_170);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (allocator<char> *)in_stack_fffffffffffffba0);
    std::allocator<char>::~allocator(&local_191);
    local_192 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_1a8 = (Impl *)local_78.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
                 (LogicalConstant)in_stack_fffffffffffffb80.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      local_1b8 = (Impl *)local_80.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
                 (LogicalConstant)in_stack_fffffffffffffb80.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      lhs_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb8c;
      lhs_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb88;
      local_1c0.super_ExprBase.impl_ =
           (ExprBase)
           mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                     (in_stack_fffffffffffffb78,(Kind)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                      lhs_01,(LogicalExpr)in_stack_fffffffffffffb80.impl_);
    }
    if ((local_192 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffba0,
                 (char (*) [132])CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_1c4 = 2;
    }
    else {
      local_1c4 = 0;
    }
    std::__cxx11::string::~string(local_190);
    if (local_1c4 != 0) goto LAB_00128c50;
  }
  else {
LAB_00128c50:
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x128c6c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x128ccf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x128d27);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (allocator<char> *)in_stack_fffffffffffffba0);
    std::allocator<char>::~allocator(&local_219);
    local_21a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x128de9);
      local_238 = (Impl *)local_80.super_ExprBase.impl_;
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
                 (LogicalConstant)in_stack_fffffffffffffb80.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
      lhs_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb8c;
      lhs_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb88;
      local_240.super_ExprBase.impl_ =
           (ExprBase)
           mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                     (in_stack_fffffffffffffb78,(Kind)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                      lhs_02,(LogicalExpr)in_stack_fffffffffffffb80.impl_);
    }
    if ((local_21a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffba0,
                 (char (*) [143])CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_1c4 = 3;
    }
    else {
      local_1c4 = 0;
    }
    std::__cxx11::string::~string(local_218);
    if (local_1c4 != 0) goto LAB_00129119;
  }
  else {
LAB_00129119:
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x129135);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x129192);
  }
  kind = (Kind)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1291ea);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_270);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (allocator<char> *)in_stack_fffffffffffffba0);
    std::allocator<char>::~allocator(&local_291);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
                 (LogicalConstant)in_stack_fffffffffffffb80.impl_,kind);
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x1292ba);
      lhs_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb8c;
      lhs_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb88;
      mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                (in_stack_fffffffffffffb78,kind,lhs_03,(LogicalExpr)in_stack_fffffffffffffb80.impl_)
      ;
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffba0,
               (char (*) [143])CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    local_1c4 = 4;
    std::__cxx11::string::~string(local_290);
    if (local_1c4 == 0) goto LAB_0012965b;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffba0);
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1295b6);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
             in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c,
             (char *)in_stack_fffffffffffffb80.impl_);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffbf0,(Message *)in_stack_fffffffffffffbe8);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x129613);
LAB_0012965b:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129668);
  return;
}

Assistant:

TEST_F(ExprTest, BinaryLogicalExpr) {
  mp::BinaryLogicalExpr e;
  EXPECT_TRUE(e == 0);
  (void)LogicalExpr(e);
  auto lhs = factory_.MakeLogicalConstant(true);
  auto rhs = factory_.MakeLogicalConstant(false);
  e = factory_.MakeBinaryLogical(expr::AND, lhs, rhs);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::AND, e.kind());
  EXPECT_EQ(lhs, e.lhs());
  EXPECT_EQ(rhs, e.rhs());
  EXPECT_ASSERT(factory_.MakeBinaryLogical(expr::LT, lhs, rhs),
                "invalid expression kind");
  EXPECT_ASSERT(factory_.MakeBinaryLogical(expr::AND, LogicalExpr(), rhs),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeBinaryLogical(expr::AND, lhs, LogicalExpr()),
                "invalid argument");
}